

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_attribute.c
# Opt level: O0

attribute_conflict
attribute_create(klass cls,char *name,type t,attribute_impl impl,class_visibility_id visibility,
                attribute_impl_interface_singleton singleton)

{
  size_t sVar1;
  char *pcVar2;
  attribute_impl in_RCX;
  type in_RDX;
  char *in_RSI;
  klass in_RDI;
  class_visibility_id in_R8D;
  code *in_R9;
  size_t size;
  attribute_conflict attr;
  attribute_interface local_50;
  attribute_conflict local_8;
  
  local_8 = (attribute_conflict)malloc(0x30);
  if (local_8 == (attribute_conflict)0x0) {
    local_8 = (attribute_conflict)0x0;
  }
  else {
    if (in_RSI == (char *)0x0) {
      local_8->name = (char *)0x0;
    }
    else {
      sVar1 = strlen(in_RSI);
      pcVar2 = (char *)malloc(sVar1 + 1);
      local_8->name = pcVar2;
      if (local_8->name != (char *)0x0) {
        memcpy(local_8->name,in_RSI,sVar1 + 1);
      }
    }
    local_8->cls = in_RDI;
    local_8->t = in_RDX;
    local_8->impl = in_RCX;
    local_8->visibility = in_R8D;
    if (in_R9 == (code *)0x0) {
      local_50 = (attribute_interface)0x0;
    }
    else {
      local_50 = (attribute_interface)(*in_R9)();
    }
    local_8->iface = local_50;
  }
  return local_8;
}

Assistant:

attribute attribute_create(klass cls, const char *name, type t, attribute_impl impl, enum class_visibility_id visibility, attribute_impl_interface_singleton singleton)
{
	attribute attr = malloc(sizeof(struct attribute_type));

	if (attr == NULL)
	{
		return NULL;
	}

	if (name != NULL)
	{
		size_t size = strlen(name) + 1;

		attr->name = malloc(sizeof(char) * size);

		if (attr->name != NULL)
		{
			memcpy(attr->name, name, size);
		}
	}
	else
	{
		attr->name = NULL;
	}

	attr->cls = cls;
	attr->t = t;
	attr->impl = impl;
	attr->visibility = visibility;
	attr->iface = singleton ? singleton() : NULL;

	return attr;
}